

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

buffer * bfind(char *bname,int cflag)

{
  byte bVar1;
  int iVar2;
  buffer *__ptr;
  line *plVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  buffer **ppbVar7;
  long lVar8;
  
  ppbVar7 = &bheadp;
  while (ppbVar7 = (buffer **)(((buffer *)ppbVar7)->b_list).l_p.l_wp,
        (buffer *)ppbVar7 != (buffer *)0x0) {
    iVar2 = strcmp(bname,(((buffer *)ppbVar7)->b_list).l_name);
    if (iVar2 == 0) {
      return (buffer *)ppbVar7;
    }
  }
  if (cflag != 1) {
    return (buffer *)0x0;
  }
  __ptr = (buffer *)calloc(1,0x8c0);
  if (__ptr == (buffer *)0x0) {
    dobeep();
    lVar8 = 0x8c0;
  }
  else {
    plVar3 = lalloc(0);
    if (plVar3 == (line *)0x0) {
      free(__ptr);
      return (buffer *)0x0;
    }
    __ptr->b_dotp = plVar3;
    bVar1 = (byte)defb_flag;
    __ptr->b_flag = (byte)defb_flag;
    sVar4 = strlen(bname);
    if (((sVar4 != 0) && (*bname == '*')) && (bname[sVar4 - 1] == '*')) {
      __ptr->b_flag = bVar1 | 0x40;
    }
    __ptr->b_headp = plVar3;
    iVar2 = defb_nmodes;
    __ptr->b_nmodes = (short)defb_nmodes;
    (__ptr->b_undo).tqh_last = &(__ptr->b_undo).tqh_first;
    uVar5 = (ulong)(uint)iVar2;
    if (iVar2 < 1) {
      uVar5 = 0;
    }
    memcpy(__ptr->b_modes,defb_modes,uVar5 * 8 + 8);
    __ptr->b_fname[0] = '\0';
    __ptr->b_cwd[0] = '\0';
    (__ptr->b_fi).fi_uid = 0;
    (__ptr->b_fi).fi_gid = 0;
    *(undefined8 *)&(__ptr->b_fi).fi_mode = 0;
    (__ptr->b_fi).fi_mtime.tv_sec = 0;
    (__ptr->b_fi).fi_mtime.tv_nsec = 0;
    plVar3->l_fp = plVar3;
    plVar3->l_bp = plVar3;
    (__ptr->b_list).l_p.x_bp = bheadp;
    bheadp = __ptr;
    __ptr->b_dotline = 1;
    __ptr->b_markline = 1;
    __ptr->b_lines = 1;
    __ptr->b_nlseq = "\n";
    __ptr->b_nlchr = "\n";
    __ptr->b_tabw = defb_tabw;
    pcVar6 = strdup(bname);
    (__ptr->b_list).l_name = pcVar6;
    if (pcVar6 != (char *)0x0) {
      return __ptr;
    }
    dobeep();
    sVar4 = strlen(bname);
    lVar8 = sVar4 + 1;
  }
  ewprintf("Can\'t get %d bytes",lVar8);
  return (buffer *)0x0;
}

Assistant:

struct buffer *
bfind(const char *bname, int cflag)
{
	struct buffer	*bp;

	bp = bheadp;
	while (bp != NULL) {
		if (strcmp(bname, bp->b_bname) == 0)
			return (bp);
		bp = bp->b_bufp;
	}
	if (cflag != TRUE)
		return (NULL);

	bp = bnew(bname);

	return (bp);
}